

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O0

void __thiscall Room::Room(Room *this)

{
  Room *this_local;
  
  this->_vptr_Room = (_func_int **)&PTR___cxa_pure_virtual_00114da8;
  std::__cxx11::string::string((string *)&this->rstate0);
  std::__cxx11::string::string((string *)&this->rstate1);
  std::__cxx11::string::string((string *)&this->rstate2);
  std::__cxx11::string::string((string *)&this->rsdesc1);
  std::__cxx11::string::string((string *)&this->rsdesc2);
  std::__cxx11::string::string((string *)&this->rsdesc3);
  std::__cxx11::string::string((string *)&this->rsdesc4);
  std::__cxx11::string::string((string *)&this->roomName);
  std::__cxx11::string::string((string *)&this->displayName);
  return;
}

Assistant:

Room::Room(){}